

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>::
~ParticleArrayTest_IndexAccess_Test
          (ParticleArrayTest_IndexAccess_Test<pica::ParticleArrayAoS<pica::Particle<(pica::Dimension)3>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x20);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, IndexAccess)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;
    typedef typename ParticleArrayTest<TypeParam>::Particle ParticleType;

    ParticleArray particles;
    const int numParticles = 15;
    ParticleType particleArray[numParticles];
    for (int i = 0; i < numParticles; i++) {
        ParticleType particle = this->randomParticle();
        particleArray[i] = particle;
        particles.pushBack(particle);
    }
    const ParticleArray constParticles = particles;
    ASSERT_EQ(numParticles, particles.size());
    ASSERT_EQ(numParticles, constParticles.size());
    for (int i = 0; i < numParticles; i++) {
        EXPECT_TRUE(this->eqParticles_(particleArray[i], particles[i]));
        EXPECT_TRUE(this->eqParticles_(particleArray[i], constParticles[i]));
    }
}